

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::RationalTangentialThinPrismDistortion::transform
          (RationalTangentialThinPrismDistortion *this,double *x,double *y,double xd,double yd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = xd * xd + yd * yd;
  dVar6 = dVar5 * dVar5;
  dVar7 = (dVar5 * dVar6 * this->kd[4] + dVar6 * this->kd[3] + dVar5 * this->kd[2] + 1.0) /
          (dVar5 * dVar6 * this->kd[7] + dVar6 * this->kd[6] + dVar5 * this->kd[5] + 1.0);
  dVar1 = this->kd[0];
  dVar2 = this->kd[1];
  dVar3 = this->kd[10];
  dVar4 = this->kd[0xb];
  *x = this->kd[9] * dVar6 +
       this->kd[8] * dVar5 +
       ((xd + xd) * xd + dVar5) * dVar2 + xd * dVar7 + (dVar1 + dVar1) * xd * yd;
  *y = dVar6 * dVar4 +
       dVar5 * dVar3 + (dVar2 + dVar2) * xd * yd + dVar7 * yd + ((yd + yd) * yd + dVar5) * dVar1;
  return;
}

Assistant:

void RationalTangentialThinPrismDistortion::transform(double &x, double &y, double xd, double yd) const
{
  const double r2=xd*xd+yd*yd;
  const double r4=r2*r2;
  const double r6=r4*r2;

  const double s=(1.0 + kd[2]*r2 + kd[3]*r4 + kd[4]*r6) /
                 (1.0 + kd[5]*r2 + kd[6]*r4 + kd[7]*r6);

  const double xx=xd*s + 2*kd[0]*xd*yd        +   kd[1]*(r2+2*xd*xd) + kd[8]*r2 + kd[9]*r4;
  const double yy=yd*s +   kd[0]*(r2+2*yd*yd) + 2*kd[1]*xd*yd        + kd[10]*r2 + kd[11]*r4;

  x=xx;
  y=yy;
}